

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

void test_read_num<int,int,int(*)(char_const**,int*)>
               (int num1,_func_int_char_ptr_ptr_int_ptr *read_f,bool is_ok)

{
  byte bVar1;
  mp_type mVar2;
  int iVar3;
  int iVar4;
  uint64_t uVar5;
  ulong uVar6;
  char *pcVar7;
  undefined8 uVar8;
  long lVar9;
  float fVar10;
  double dVar11;
  char *mp_num_pos1;
  int num2;
  uint64_t local_258;
  float local_24c;
  char *mp_num_pos2;
  double local_240;
  char mp_nums [16] [16];
  char str [256];
  undefined1 local_38 [8];
  
  builtin_strncpy(str,"typed read of ",0xf);
  local_258 = (uint64_t)num1;
  if (num1 < 0) {
    pcVar7 = "%lld";
    uVar6 = local_258;
  }
  else {
    pcVar7 = "%llu";
    uVar6 = (ulong)(uint)num1;
  }
  iVar3 = snprintf(str + 0xe,0xf2,pcVar7,uVar6);
  pcVar7 = str + 0xe + iVar3;
  iVar3 = snprintf(pcVar7,(size_t)(local_38 + -(long)pcVar7)," into ");
  snprintf(pcVar7 + iVar3,(size_t)(local_38 + -(long)(pcVar7 + iVar3)),"int%zu_t",0x20);
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fputs(str,_stdout);
  fputc(10,_stdout);
  iVar3 = 0;
  if (-1 < num1) {
    iVar3 = test_encode_uint_all_sizes(mp_nums,(ulong)(uint)num1);
  }
  iVar4 = test_encode_int_all_sizes(mp_nums + iVar3,local_258);
  local_24c = (float)num1;
  local_240 = (double)num1;
  uVar6 = (ulong)(uint)(iVar3 + iVar4);
  if (iVar3 + iVar4 < 1) {
    uVar6 = 0;
  }
  lVar9 = 0;
  do {
    if (uVar6 * 0x10 == lVar9) {
      return;
    }
    pcVar7 = mp_nums[0] + lVar9;
    bVar1 = *pcVar7;
    mVar2 = mp_type_hint[bVar1];
    mp_num_pos1 = pcVar7;
    if (mVar2 == MP_UINT) {
      uVar5 = mp_decode_uint(&mp_num_pos1);
      if (uVar5 != local_258) {
        pcVar7 = "mp_decode_uint(&mp_num_pos1) == (uint64_t)num1";
        uVar8 = 0x72a;
        goto LAB_00124341;
      }
    }
    else if (mVar2 == MP_FLOAT) {
      fVar10 = mp_decode_float(&mp_num_pos1);
      if ((fVar10 != local_24c) || (NAN(fVar10) || NAN(local_24c))) {
        pcVar7 = "mp_decode_float(&mp_num_pos1) == (float)num1";
        uVar8 = 0x72d;
        goto LAB_00124341;
      }
    }
    else if (mVar2 == MP_INT) {
      uVar5 = mp_decode_int(&mp_num_pos1);
      if (uVar5 != local_258) {
        pcVar7 = "mp_decode_int(&mp_num_pos1) == (int64_t)num1";
        uVar8 = 0x727;
        goto LAB_00124341;
      }
    }
    else {
      dVar11 = mp_decode_double(&mp_num_pos1);
      if ((dVar11 != local_240) || (NAN(dVar11) || NAN(local_240))) {
        pcVar7 = "mp_decode_double(&mp_num_pos1) == (double)num1";
        uVar8 = 0x730;
        goto LAB_00124341;
      }
    }
    num2 = 0;
    mp_num_pos2 = pcVar7;
    iVar3 = mp_read_int32(&mp_num_pos2,&num2);
    _ok((uint)(iVar3 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar1);
    _ok((uint)(mp_num_pos1 == mp_num_pos2),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    if (num1 < 0) {
      if (-1 < num2) {
        pcVar7 = "num2 < 0";
        uVar8 = 0x745;
        goto LAB_00124341;
      }
      pcVar7 = "(int64_t)num1 == (int64_t)num2";
      iVar3 = 0x746;
    }
    else {
      if (num2 < 0) {
        pcVar7 = "num2 >= 0";
        uVar8 = 0x742;
LAB_00124341:
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar7,"false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,uVar8,"test_read_num");
        exit(-1);
      }
      pcVar7 = "(uint64_t)num1 == (uint64_t)num2";
      iVar3 = 0x743;
    }
    _ok((uint)(num2 == num1),pcVar7,
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        iVar3,"check int number");
    lVar9 = lVar9 + 0x10;
  } while( true );
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}